

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void LzmaEnc_FastPosInit(Byte *g_FastPos)

{
  ulong uVar1;
  size_t j;
  size_t k;
  uint slot;
  Byte *g_FastPos_local;
  
  *g_FastPos = '\0';
  g_FastPos[1] = '\x01';
  g_FastPos_local = g_FastPos + 2;
  for (slot = 2; slot < 0x1a; slot = slot + 1) {
    uVar1 = 1L << ((char)(slot >> 1) - 1U & 0x3f);
    for (j = 0; j < uVar1; j = j + 1) {
      g_FastPos_local[j] = (Byte)slot;
    }
    g_FastPos_local = g_FastPos_local + uVar1;
  }
  return;
}

Assistant:

static void LzmaEnc_FastPosInit(Byte *g_FastPos)
{
  unsigned slot;
  g_FastPos[0] = 0;
  g_FastPos[1] = 1;
  g_FastPos += 2;
  
  for (slot = 2; slot < kNumLogBits * 2; slot++)
  {
    size_t k = ((size_t)1 << ((slot >> 1) - 1));
    size_t j;
    for (j = 0; j < k; j++)
      g_FastPos[j] = (Byte)slot;
    g_FastPos += k;
  }
}